

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O0

void __thiscall
kratos::GeneratorConnectivityVisitor::visit(GeneratorConnectivityVisitor *this,Generator *generator)

{
  undefined1 auVar1 [4];
  bool bVar2;
  PortDirection PVar3;
  int iVar4;
  uint uVar5;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  element_type *peVar6;
  undefined4 extraout_var;
  StmtException *this_01;
  remove_reference_t<unsigned_int_&> *in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  format_args args;
  __normal_iterator<kratos::Stmt_**,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>_>
  local_1f8;
  __normal_iterator<kratos::Stmt*const*,std::vector<kratos::Stmt*,std::allocator<kratos::Stmt*>>>
  local_1f0 [8];
  __normal_iterator<kratos::Stmt_**,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>_>
  local_1e8;
  __normal_iterator<kratos::Stmt*const*,std::vector<kratos::Stmt*,std::allocator<kratos::Stmt*>>>
  local_1e0 [8];
  char local_1d8 [32];
  string local_1b8;
  _Node_iterator_base<unsigned_int,_false> local_198;
  _Node_iterator_base<unsigned_int,_false> local_190;
  undefined1 local_184 [4];
  element_type *peStack_180;
  uint32_t i;
  __shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2> *local_178;
  value_type *stmt;
  const_iterator __end4;
  const_iterator __begin4;
  unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  *__range4;
  vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_> stmt_list;
  undefined1 local_128 [7];
  bool has_error;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  bits;
  undefined1 local_e8 [24];
  shared_ptr<kratos::Port> *port;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *port_name;
  iterator __end2;
  iterator __begin2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *port_names;
  Generator *generator_local;
  GeneratorConnectivityVisitor *this_local;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_90;
  basic_string_view<char> local_88;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_78;
  undefined8 local_58;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *vargs;
  char (*local_48) [58];
  char *local_40 [2];
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *local_20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_18;
  
  bVar2 = Generator::external(generator);
  if ((!bVar2) && (bVar2 = Generator::is_stub(generator), !bVar2)) {
    this_00 = Generator::get_port_names_abi_cxx11_(generator);
    __end2 = std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(this_00);
    port_name = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end(this_00);
    while (bVar2 = std::operator!=(&__end2,(_Self *)&port_name), bVar2) {
      port = (shared_ptr<kratos::Port> *)
             std::
             _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end2);
      Generator::get_port((Generator *)local_e8,(string *)generator);
      local_e8._16_8_ = local_e8;
      peVar6 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_e8._16_8_);
      PVar3 = Port::port_direction(peVar6);
      if ((PVar3 == In) && ((this->is_top_level_ & 1U) != 0)) {
        bits._M_h._M_single_bucket._4_4_ = 3;
      }
      else {
        std::
        unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
        ::unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                         *)local_128);
        bVar2 = connected((shared_ptr<kratos::Port> *)local_e8._16_8_,
                          (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                           *)local_128);
        if (((bVar2 ^ 0xffU) & 1) != 0) {
          std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>::vector
                    ((vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_> *)&__range4);
          peVar6 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_e8._16_8_);
          iVar4 = (*(peVar6->super_Var).super_IRNode._vptr_IRNode[0x10])();
          __end4 = std::
                   unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                   ::begin((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                            *)CONCAT44(extraout_var,iVar4));
          stmt = (value_type *)
                 std::
                 unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                 ::end((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                        *)CONCAT44(extraout_var,iVar4));
          while (bVar2 = std::__detail::operator!=
                                   (&__end4.
                                     super__Node_iterator_base<std::shared_ptr<kratos::AssignStmt>,_false>
                                    ,(_Node_iterator_base<std::shared_ptr<kratos::AssignStmt>,_false>
                                      *)&stmt), bVar2) {
            local_178 = &std::__detail::
                         _Node_const_iterator<std::shared_ptr<kratos::AssignStmt>,_true,_false>::
                         operator*(&__end4)->
                         super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>;
            peStack_180 = std::__shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>::get
                                    (local_178);
            std::vector<kratos::Stmt*,std::allocator<kratos::Stmt*>>::
            emplace_back<kratos::AssignStmt*>
                      ((vector<kratos::Stmt*,std::allocator<kratos::Stmt*>> *)&__range4,
                       &stack0xfffffffffffffe80);
            std::__detail::_Node_const_iterator<std::shared_ptr<kratos::AssignStmt>,_true,_false>::
            operator++(&__end4);
          }
          local_184 = (undefined1  [4])0x0;
          while( true ) {
            auVar1 = local_184;
            peVar6 = std::
                     __shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_e8._16_8_);
            uVar5 = (*(peVar6->super_Var).super_IRNode._vptr_IRNode[7])();
            if (uVar5 <= (uint)auVar1) break;
            local_190._M_cur =
                 (__node_type *)
                 std::
                 unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                 ::find((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                         *)local_128,(key_type *)local_184);
            local_198._M_cur =
                 (__node_type *)
                 std::
                 unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                 ::end((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                        *)local_128);
            bVar2 = std::__detail::operator==(&local_190,&local_198);
            if (bVar2) {
              this_01 = (StmtException *)__cxa_allocate_exception(0x10);
              peVar6 = std::
                       __shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                       operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_e8._16_8_);
              (*(peVar6->super_Var).super_IRNode._vptr_IRNode[0x20])(local_1d8);
              local_40[1] = (char *)&local_1b8;
              local_40[0] = "{0}[{1}] is a floating net. Please check your connections";
              local_48 = (char (*) [58])local_1d8;
              vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                       *)local_184;
              fmt::v7::make_args_checked<std::__cxx11::string,unsigned_int&,char[58],char>
                        (&local_78,(v7 *)"{0}[{1}] is a floating net. Please check your connections"
                         ,local_48,(remove_reference_t<std::__cxx11::basic_string<char>_> *)vargs,
                         in_R8);
              local_58 = &local_78;
              local_88 = fmt::v7::to_string_view<char,_0>(local_40[0]);
              local_28 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                          *)&this_local;
              local_30 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                          *)local_58;
              local_20 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                          *)local_58;
              local_18._8_8_ = local_58;
              local_18._M_allocated_capacity = (size_type)local_28;
              fmt::v7::
              basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
              ::basic_format_args(local_28,0x2d,
                                  (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                                   *)local_58);
              format_str.size_ = (size_t)this_local;
              format_str.data_ = (char *)local_88.size_;
              args.
              super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
              .field_1.values_ = in_R9.values_;
              args.
              super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
              .desc_ = (unsigned_long_long)local_90.values_;
              fmt::v7::detail::vformat_abi_cxx11_
                        (&local_1b8,(detail *)local_88.data_,format_str,args);
              local_1e8._M_current =
                   (Stmt **)std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>::begin
                                      ((vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_> *)
                                       &__range4);
              __gnu_cxx::
              __normal_iterator<kratos::Stmt*const*,std::vector<kratos::Stmt*,std::allocator<kratos::Stmt*>>>
              ::__normal_iterator<kratos::Stmt**>(local_1e0,&local_1e8);
              local_1f8._M_current =
                   (Stmt **)std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>::end
                                      ((vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_> *)
                                       &__range4);
              __gnu_cxx::
              __normal_iterator<kratos::Stmt*const*,std::vector<kratos::Stmt*,std::allocator<kratos::Stmt*>>>
              ::__normal_iterator<kratos::Stmt**>(local_1f0,&local_1f8);
              StmtException::StmtException
                        (this_01,&local_1b8,(const_iterator *)local_1e0,(const_iterator *)local_1f0)
              ;
              __cxa_throw(this_01,&StmtException::typeinfo,StmtException::~StmtException);
            }
            local_184 = (undefined1  [4])((int)local_184 + 1);
          }
          std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>::~vector
                    ((vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_> *)&__range4);
        }
        std::
        unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
        ::~unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                          *)local_128);
        bits._M_h._M_single_bucket._4_4_ = 0;
      }
      std::shared_ptr<kratos::Port>::~shared_ptr((shared_ptr<kratos::Port> *)local_e8);
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end2);
    }
    this->is_top_level_ = false;
  }
  return;
}

Assistant:

void visit(Generator* generator) override {
        // skip if it's an external module or stub module
        if (generator->external() || generator->is_stub()) return;
        const auto& port_names = generator->get_port_names();
        for (const auto& port_name : port_names) {
            auto const& port = generator->get_port(port_name);

            // based on whether it's an input or output
            // for inputs, if it's not top generator, we need to check if
            // something is driving it
            if (port->port_direction() == PortDirection::In) {
                if (is_top_level_) continue;
            }

            std::unordered_set<uint32_t> bits;
            bool has_error = !connected(port, bits);

            if (has_error) {
                std::vector<Stmt*> stmt_list;
                for (auto const& stmt : port->sources()) {
                    stmt_list.emplace_back(stmt.get());
                }
                for (uint32_t i = 0; i < port->width(); i++) {
                    if (bits.find(i) == bits.end()) {
                        throw StmtException(
                            ::format("{0}[{1}] is a floating net. Please check your connections",
                                     port->handle_name(), i),
                            stmt_list.begin(), stmt_list.end());
                    }
                }
            }
        }

        is_top_level_ = false;
    }